

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

StringTree * capnp::compiler::expressionStringTree(Reader exp)

{
  int *__return_storage_ptr__;
  ArrayDisposer **__return_storage_ptr___00;
  Reader *__return_storage_ptr___01;
  Reader *__return_storage_ptr___02;
  Reader exp_00;
  Reader params;
  Reader exp_01;
  Reader params_00;
  Reader exp_02;
  bool bVar1;
  Which WVar2;
  uint uVar3;
  uint *params_1;
  char (*params_01) [14];
  StringTree *in_RDI;
  Reader *in_R8;
  char *in_R9;
  Reader RVar4;
  Iterator IVar5;
  StringPtr chars;
  StringPtr chars_00;
  StringPtr chars_01;
  undefined8 in_stack_fffffffffffff9a8;
  Reader local_5c8;
  ArrayPtr<const_char> local_598;
  undefined1 local_581 [49];
  undefined1 local_550 [64];
  Reader member;
  undefined1 local_4e0 [40];
  undefined1 auStack_4b8 [71];
  undefined1 local_471 [49];
  undefined1 local_440 [64];
  Reader app;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  StringPtr local_3a8;
  Array<kj::StringTree> local_398;
  StringTree local_380;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  StringTree local_318;
  undefined1 auStack_2e0 [8];
  Reader element;
  undefined1 local_2a0 [8];
  Iterator __end3;
  undefined1 local_280 [8];
  Iterator __begin3;
  Reader *__range3;
  ArrayBuilder<kj::StringTree> parts;
  Reader list;
  compiler *local_1e8;
  char *pcStack_1e0;
  StringTree local_1c0;
  Reader local_178;
  ArrayPtr<const_char> local_148;
  compiler *local_138;
  class_kj__Own_72 cStack_130;
  StringTree local_120;
  Reader local_e8;
  StringPtr local_b8;
  undefined1 local_a1 [49];
  StringPtr local_70;
  ArrayPtr<const_unsigned_char> local_60;
  StringPtr local_50;
  compiler *local_40;
  char *local_38;
  double local_30;
  uint64_t local_28;
  UnknownType local_19;
  class_kj__Maybe_164 local_18;
  
  WVar2 = Expression::Reader::which((Reader *)&stack0x00000008);
  params_1 = &switchD_006547dc::switchdataD_00a5c2e0;
  switch(WVar2) {
  case UNKNOWN:
    kj::strTree<char_const(&)[14]>(in_RDI,(kj *)"<parse error>",params_01);
    break;
  case POSITIVE_INT:
    local_18.PointerType = (void *)Expression::Reader::getPositiveInt((Reader *)&stack0x00000008);
    kj::strTree<unsigned_long>(in_RDI,(unsigned_long *)&stack0xffffffffffffffe8);
    break;
  case NEGATIVE_INT:
    local_19 = '-';
    local_28 = Expression::Reader::getNegativeInt((Reader *)&stack0x00000008);
    kj::strTree<char,unsigned_long>
              (in_RDI,(kj *)&stack0xffffffffffffffe7,(char *)&local_28,(unsigned_long *)params_1);
    break;
  case FLOAT:
    local_30 = Expression::Reader::getFloat((Reader *)&stack0x00000008);
    kj::strTree<double>(in_RDI,&local_30);
    break;
  case STRING:
    local_50.content =
         (ArrayPtr<const_char>)Expression::Reader::getString((Reader *)&stack0x00000008);
    local_40 = (compiler *)local_50.content.ptr;
    local_38 = (char *)local_50.content.size_;
    chars.content.size_ = (size_t)params_1;
    chars.content.ptr = (char *)local_50.content.size_;
    stringLiteralStringTree(in_RDI,(compiler *)local_50.content.ptr,chars);
    break;
  case RELATIVE_NAME:
    Expression::Reader::getRelativeName((Reader *)(local_a1 + 1),(Reader *)&stack0x00000008);
    local_70.content = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)(local_a1 + 1))
    ;
    kj::strTree<capnp::Text::Reader>(in_RDI,(Reader *)&local_70);
    break;
  case LIST:
    __return_storage_ptr___00 = &parts.disposer;
    Expression::Reader::getList((Reader *)__return_storage_ptr___00,(Reader *)&stack0x00000008);
    uVar3 = List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::size
                      ((Reader *)__return_storage_ptr___00);
    kj::heapArrayBuilder<kj::StringTree>((ArrayBuilder<kj::StringTree> *)&__range3,(ulong)uVar3);
    __begin3._8_8_ = __return_storage_ptr___00;
    IVar5 = List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::begin
                      ((Reader *)__return_storage_ptr___00);
    __end3._8_8_ = IVar5.container;
    __begin3.container._0_4_ = IVar5.index;
    local_280 = (undefined1  [8])__end3._8_8_;
    IVar5 = List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::end((Reader *)__begin3._8_8_)
    ;
    element._reader._40_8_ = IVar5.container;
    __end3.container._0_4_ = IVar5.index;
    local_2a0 = (undefined1  [8])element._reader._40_8_;
    while (bVar1 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                   ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                                 *)local_280,
                                (IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                                 *)local_2a0), ((bVar1 ^ 0xffU) & 1) != 0) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
      ::operator*((Reader *)auStack_2e0,
                  (IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                   *)local_280);
      local_328 = element._reader.pointers;
      uStack_320 = element._reader._32_8_;
      local_338 = element._reader.capTable;
      uStack_330 = element._reader.data;
      local_348 = auStack_2e0;
      uStack_340 = element._reader.segment;
      exp_00._reader.capTable = element._reader.capTable;
      exp_00._reader.segment = element._reader.segment;
      exp_00._reader.data = element._reader.data;
      exp_00._reader.pointers = element._reader.pointers;
      exp_00._reader.dataSize = element._reader.dataSize;
      exp_00._reader.pointerCount = element._reader.pointerCount;
      exp_00._reader._38_2_ = element._reader._38_2_;
      exp_00._reader._40_8_ = in_stack_fffffffffffff9a8;
      expressionStringTree(exp_00);
      kj::ArrayBuilder<kj::StringTree>::add<kj::StringTree>
                ((ArrayBuilder<kj::StringTree> *)&__range3,&local_318);
      kj::StringTree::~StringTree(&local_318);
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                    *)local_280);
    }
    kj::ArrayBuilder<kj::StringTree>::finish(&local_398,(ArrayBuilder<kj::StringTree> *)&__range3);
    kj::StringPtr::StringPtr(&local_3a8,", ");
    kj::StringTree::StringTree(&local_380,&local_398,local_3a8);
    kj::strTree<char_const(&)[3],kj::StringTree,char_const(&)[3]>
              (in_RDI,(kj *)"[ ",(char (*) [3])&local_380,(StringTree *)0xa0db02,(char (*) [3])in_R8
              );
    kj::StringTree::~StringTree(&local_380);
    kj::Array<kj::StringTree>::~Array(&local_398);
    kj::ArrayBuilder<kj::StringTree>::~ArrayBuilder((ArrayBuilder<kj::StringTree> *)&__range3);
    break;
  case TUPLE:
    Expression::Reader::getTuple((Reader *)&app._reader.nestingLimit,(Reader *)&stack0x00000008);
    params.reader.capTable = (CapTableReader *)local_3c8;
    params.reader.segment = (SegmentReader *)uStack_3d0;
    params.reader.ptr = (byte *)uStack_3c0;
    params.reader._24_8_ = local_3b8;
    params.reader._32_8_ = uStack_3b0;
    params.reader._40_8_ = in_stack_fffffffffffff9a8;
    tupleLiteral(params);
    break;
  case BINARY:
    local_60 = (ArrayPtr<const_unsigned_char>)
               Expression::Reader::getBinary((Reader *)&stack0x00000008);
    binaryLiteralStringTree(in_RDI,(Reader)local_60);
    break;
  case APPLICATION:
    __return_storage_ptr___01 = (Reader *)(local_440 + 0x38);
    Expression::Reader::getApplication(__return_storage_ptr___01,(Reader *)&stack0x00000008);
    Expression::Application::Reader::getFunction
              ((Reader *)(local_471 + 1),__return_storage_ptr___01);
    exp_01._reader.capTable = (CapTableReader *)local_471._17_8_;
    exp_01._reader.segment = (SegmentReader *)local_471._9_8_;
    exp_01._reader.data = (void *)local_471._25_8_;
    exp_01._reader.pointers = (WirePointer *)local_471._33_8_;
    exp_01._reader.dataSize = local_471._41_4_;
    exp_01._reader.pointerCount = local_471._45_2_;
    exp_01._reader._38_2_ = local_471._47_2_;
    exp_01._reader._40_8_ = in_stack_fffffffffffff9a8;
    expressionStringTree(exp_01);
    local_471[0] = 0x28;
    Expression::Application::Reader::getParams((Reader *)local_4e0,__return_storage_ptr___01);
    params_00.reader.capTable = (CapTableReader *)local_4e0._16_8_;
    params_00.reader.segment = (SegmentReader *)local_4e0._8_8_;
    params_00.reader.ptr = (byte *)local_4e0._24_8_;
    params_00.reader.elementCount = local_4e0._32_4_;
    params_00.reader.step = local_4e0._36_4_;
    params_00.reader.structDataSize = auStack_4b8._0_4_;
    params_00.reader.structPointerCount = auStack_4b8._4_2_;
    params_00.reader.elementSize = auStack_4b8[6];
    params_00.reader._39_1_ = auStack_4b8[7];
    params_00.reader._40_8_ = in_stack_fffffffffffff9a8;
    tupleLiteral(params_00);
    member._reader._47_1_ = 0x29;
    kj::strTree<kj::StringTree,char,kj::StringTree,char>
              (in_RDI,(kj *)local_440,(StringTree *)local_471,auStack_4b8 + 8,
               (StringTree *)&member._reader.field_0x2f,in_R9);
    kj::StringTree::~StringTree((StringTree *)(auStack_4b8 + 8));
    kj::StringTree::~StringTree((StringTree *)local_440);
    break;
  case MEMBER:
    __return_storage_ptr___02 = (Reader *)(local_550 + 0x38);
    Expression::Reader::getMember(__return_storage_ptr___02,(Reader *)&stack0x00000008);
    Expression::Member::Reader::getParent((Reader *)(local_581 + 1),__return_storage_ptr___02);
    exp_02._reader.capTable = (CapTableReader *)local_581._17_8_;
    exp_02._reader.segment = (SegmentReader *)local_581._9_8_;
    exp_02._reader.data = (void *)local_581._25_8_;
    exp_02._reader.pointers = (WirePointer *)local_581._33_8_;
    exp_02._reader.dataSize = local_581._41_4_;
    exp_02._reader.pointerCount = local_581._45_2_;
    exp_02._reader._38_2_ = local_581._47_2_;
    exp_02._reader._40_8_ = in_stack_fffffffffffff9a8;
    expressionStringTree(exp_02);
    local_581[0] = 0x2e;
    Expression::Member::Reader::getName(&local_5c8,__return_storage_ptr___02);
    local_598 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_5c8);
    kj::strTree<kj::StringTree,char,capnp::Text::Reader>
              (in_RDI,(kj *)local_550,(StringTree *)local_581,(char *)&local_598,in_R8);
    kj::StringTree::~StringTree((StringTree *)local_550);
    break;
  case ABSOLUTE_NAME:
    local_a1[0] = '.';
    Expression::Reader::getAbsoluteName(&local_e8,(Reader *)&stack0x00000008);
    local_b8.content = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_e8);
    kj::strTree<char,capnp::Text::Reader>
              (in_RDI,(kj *)local_a1,(char *)&local_b8,(Reader *)params_1);
    break;
  case IMPORT:
    Expression::Reader::getImport(&local_178,(Reader *)&stack0x00000008);
    local_148 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_178);
    local_138 = (compiler *)local_148.ptr;
    cStack_130.PointerType = (void *)local_148.size_;
    chars_00.content.size_ = (size_t)params_1;
    chars_00.content.ptr = (char *)local_148.size_;
    stringLiteralStringTree(&local_120,(compiler *)local_148.ptr,chars_00);
    kj::strTree<char_const(&)[8],kj::StringTree>
              (in_RDI,(kj *)"import ",(char (*) [8])&local_120,(StringTree *)params_1);
    kj::StringTree::~StringTree(&local_120);
    break;
  case EMBED:
    __return_storage_ptr__ = &list.reader.nestingLimit;
    Expression::Reader::getEmbed((Reader *)__return_storage_ptr__,(Reader *)&stack0x00000008);
    RVar4 = LocatedText::Reader::getValue((Reader *)__return_storage_ptr__);
    local_1e8 = RVar4.super_StringPtr.content.ptr;
    pcStack_1e0 = RVar4.super_StringPtr.content.size_;
    chars_01.content.size_ = (size_t)params_1;
    chars_01.content.ptr = pcStack_1e0;
    stringLiteralStringTree(&local_1c0,local_1e8,chars_01);
    kj::strTree<char_const(&)[7],kj::StringTree>
              (in_RDI,(kj *)"embed ",(char (*) [7])&local_1c0,(StringTree *)params_1);
    kj::StringTree::~StringTree(&local_1c0);
    break;
  default:
    kj::_::unreachable();
  }
  return in_RDI;
}

Assistant:

static kj::StringTree expressionStringTree(Expression::Reader exp) {
  switch (exp.which()) {
    case Expression::UNKNOWN:
      return kj::strTree("<parse error>");
    case Expression::POSITIVE_INT:
      return kj::strTree(exp.getPositiveInt());
    case Expression::NEGATIVE_INT:
      return kj::strTree('-', exp.getNegativeInt());
    case Expression::FLOAT:
      return kj::strTree(exp.getFloat());
    case Expression::STRING:
      return stringLiteralStringTree(exp.getString());
    case Expression::BINARY:
      return binaryLiteralStringTree(exp.getBinary());
    case Expression::RELATIVE_NAME:
      return kj::strTree(exp.getRelativeName().getValue());
    case Expression::ABSOLUTE_NAME:
      return kj::strTree('.', exp.getAbsoluteName().getValue());
    case Expression::IMPORT:
      return kj::strTree("import ", stringLiteralStringTree(exp.getImport().getValue()));
    case Expression::EMBED:
      return kj::strTree("embed ", stringLiteralStringTree(exp.getEmbed().getValue()));

    case Expression::LIST: {
      auto list = exp.getList();
      auto parts = kj::heapArrayBuilder<kj::StringTree>(list.size());
      for (auto element: list) {
        parts.add(expressionStringTree(element));
      }
      return kj::strTree("[ ", kj::StringTree(parts.finish(), ", "), " ]");
    }

    case Expression::TUPLE:
      return tupleLiteral(exp.getTuple());

    case Expression::APPLICATION: {
      auto app = exp.getApplication();
      return kj::strTree(expressionStringTree(app.getFunction()),
                         '(', tupleLiteral(app.getParams()), ')');
    }

    case Expression::MEMBER: {
      auto member = exp.getMember();
      return kj::strTree(expressionStringTree(member.getParent()), '.',
                         member.getName().getValue());
    }
  }

  KJ_UNREACHABLE;
}